

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void cmp_1(int exp,rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
          rtosc_cmp_options *opt,char *ldesc,char *rdesc,int line)

{
  uint uVar1;
  int b;
  char *pcVar2;
  
  printf("cmp1(%c, %c)\n",(ulong)(uint)(int)lhs->type,(ulong)(uint)(int)rhs->type);
  uVar1 = rtosc_arg_vals_cmp(lhs,rhs,lsize,rsize,opt);
  tc_full[0] = '\0';
  strncat(tc_full,ldesc,0x3ff);
  if ((uint)exp < 3) {
    pcVar2 = &DAT_0010455c + *(int *)(&DAT_0010455c + (ulong)(uint)exp * 4);
  }
  else {
    pcVar2 = "ERROR";
  }
  snprintf(tc_full,0x400,"\"%s\" %s \"%s\"",ldesc,pcVar2,rdesc);
  if (exp == 2) {
    uVar1 = (uint)(uVar1 == 0);
  }
  else if (exp == 1) {
    uVar1 = uVar1 >> 0x1f;
  }
  else {
    if (exp != 0) goto LAB_00101a6e;
    uVar1 = (uint)(0 < (int)uVar1);
  }
  assert_int_eq(1,uVar1,tc_full,line);
LAB_00101a6e:
  pcVar2 = "!=(bool)";
  if (exp == 2) {
    pcVar2 = "==(bool)";
  }
  snprintf(tc_full,0x400,"\"%s\" %s \"%s\"",ldesc,pcVar2,rdesc);
  b = rtosc_arg_vals_eq(lhs,rhs,lsize,rsize,opt);
  assert_int_eq((uint)(exp == 2),b,tc_full,line);
  return;
}

Assistant:

void cmp_1(int exp,
           rtosc_arg_val_t* lhs, rtosc_arg_val_t* rhs,
           size_t lsize, size_t rsize,
           const rtosc_cmp_options* opt,
           const char* ldesc, const char* rdesc, int line)
{
    printf("cmp1(%c, %c)\n", lhs->type, rhs->type);
    int res = rtosc_arg_vals_cmp(lhs, rhs, lsize, rsize, opt);

    *tc_full = 0;
    strncat(tc_full, ldesc, tc_len-1);
    const char* sgn = "ERROR";
    switch(exp)
    {
        case gt: sgn = " >(3way)"; break;
        case eq: sgn = "==(3way)"; break;
        case lt: sgn = " <(3way)"; break;
    }

    snprintf(tc_full, tc_len, "\"%s\" %s \"%s\"", ldesc, sgn, rdesc);

    switch(exp)
    {
        case gt: assert_int_eq(1, res  > 0, tc_full, line); break;
        case eq: assert_int_eq(1, res == 0, tc_full, line); break;
        case lt: assert_int_eq(1, res  < 0, tc_full, line); break;
    }

    int exp_eq = (exp == eq);

    sgn = exp_eq ? "==(bool)" : "!=(bool)";
    snprintf(tc_full, tc_len, "\"%s\" %s \"%s\"", ldesc, sgn, rdesc);

    res = rtosc_arg_vals_eq(lhs, rhs, lsize, rsize, opt);
    assert_int_eq(exp_eq, res, tc_full, line);
}